

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# region.hpp
# Opt level: O0

void __thiscall
toml::detail::location<std::vector<char,_std::allocator<char>_>_>::location
          (location<std::vector<char,_std::allocator<char>_>_> *this,
          location<std::vector<char,_std::allocator<char>_>_> *param_1)

{
  location<std::vector<char,_std::allocator<char>_>_> *param_1_local;
  location<std::vector<char,_std::allocator<char>_>_> *this_local;
  
  region_base::region_base(&this->super_region_base,&param_1->super_region_base);
  (this->super_region_base)._vptr_region_base = (_func_int **)&PTR__location_001a69d0;
  std::shared_ptr<const_std::vector<char,_std::allocator<char>_>_>::shared_ptr
            (&this->source_,&param_1->source_);
  this->line_number_ = param_1->line_number_;
  std::__cxx11::string::string((string *)&this->source_name_,(string *)&param_1->source_name_);
  (this->iter_)._M_current = (param_1->iter_)._M_current;
  return;
}

Assistant:

location(const location&) = default;